

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_external_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  uchar *puVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  double local_a8;
  size_t l;
  int len;
  char *tp;
  char tmp [99];
  int version_local;
  char *prefix_local;
  cram_block *b_local;
  cram_codec *c_local;
  
  l._4_4_ = 0;
  tmp._92_4_ = version;
  unique0x10000439 = prefix;
  if (prefix != (char *)0x0) {
    __n = strlen(prefix);
    while (b->alloc <= b->byte + __n) {
      if (b->alloc == 0) {
        local_a8 = 1024.0;
      }
      else {
        sVar1 = b->alloc;
        auVar6._8_4_ = (int)(sVar1 >> 0x20);
        auVar6._0_8_ = sVar1;
        auVar6._12_4_ = 0x45300000;
        local_a8 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      b->alloc = (long)local_a8 | (long)(local_a8 - 9.223372036854776e+18) & (long)local_a8 >> 0x3f;
      puVar4 = (uchar *)realloc(b->data,b->alloc);
      b->data = puVar4;
    }
    memcpy(b->data + b->byte,stack0xffffffffffffffe0,__n);
    b->byte = __n + b->byte;
    l._4_4_ = (int)__n;
  }
  if (((c->field_6).e_byte_array_len.len_encoding & 0xffffff80) == E_NULL) {
    tp._0_1_ = (byte)(c->field_6).huffman.ncodes;
    local_ac = 1;
  }
  else {
    if (((c->field_6).e_byte_array_len.len_encoding & 0xffffc000) == E_NULL) {
      tp._0_1_ = (byte)((c->field_6).e_byte_array_len.len_encoding >> 8) | 0x80;
      tp._1_1_ = (undefined1)(c->field_6).huffman.ncodes;
      local_b0 = 2;
    }
    else {
      if (((c->field_6).e_byte_array_len.len_encoding & 0xffe00000) == E_NULL) {
        tp._0_1_ = (byte)((c->field_6).e_byte_array_len.len_encoding >> 0x10) | 0xc0;
        tp._1_1_ = (undefined1)((uint)(c->field_6).huffman.ncodes >> 8);
        tp._2_1_ = (undefined1)(c->field_6).huffman.ncodes;
        local_b4 = 3;
      }
      else {
        if (((c->field_6).e_byte_array_len.len_encoding & 0xf0000000) == E_NULL) {
          tp._0_1_ = (byte)((c->field_6).e_byte_array_len.len_encoding >> 0x18) | 0xe0;
          tp._1_1_ = (undefined1)((uint)(c->field_6).huffman.ncodes >> 0x10);
          tp._2_1_ = (undefined1)((uint)(c->field_6).huffman.ncodes >> 8);
          tp._3_1_ = (undefined1)(c->field_6).huffman.ncodes;
          local_b8 = 4;
        }
        else {
          tp._0_1_ = (byte)((c->field_6).huffman.ncodes >> 0x1c) | 0xf0;
          tp._1_1_ = (undefined1)((c->field_6).huffman.ncodes >> 0x14);
          tp._2_1_ = (undefined1)((c->field_6).huffman.ncodes >> 0xc);
          tp._3_1_ = (undefined1)((c->field_6).huffman.ncodes >> 4);
          tp._4_1_ = (byte)(c->field_6).e_byte_array_len.len_encoding & 0xf;
          local_b8 = 5;
        }
        local_b4 = local_b8;
      }
      local_b0 = local_b4;
    }
    local_ac = local_b0;
  }
  pcVar5 = tmp + (long)local_ac + -8;
  iVar2 = itf8_put_blk(b,c->codec);
  iVar3 = itf8_put_blk(b,(int)pcVar5 - (int)&tp);
  while ((char *)b->alloc <= pcVar5 + (b->byte - (long)&tp)) {
    if (b->alloc == 0) {
      local_c0 = 1024.0;
    }
    else {
      sVar1 = b->alloc;
      auVar7._8_4_ = (int)(sVar1 >> 0x20);
      auVar7._0_8_ = sVar1;
      auVar7._12_4_ = 0x45300000;
      local_c0 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
    }
    b->alloc = (long)local_c0 | (long)(local_c0 - 9.223372036854776e+18) & (long)local_c0 >> 0x3f;
    puVar4 = (uchar *)realloc(b->data,b->alloc);
    b->data = puVar4;
  }
  memcpy(b->data + b->byte,&tp,(long)pcVar5 - (long)&tp);
  b->byte = (size_t)(pcVar5 + (b->byte - (long)&tp));
  return iVar3 + iVar2 + l._4_4_ + ((int)pcVar5 - (int)&tp);
}

Assistant:

int cram_external_encode_store(cram_codec *c, cram_block *b, char *prefix,
			       int version) {
    char tmp[99], *tp = tmp;
    int len = 0;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tp += itf8_put(tp, c->e_external.content_id);
    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, tp-tmp);
    BLOCK_APPEND(b, tmp, tp-tmp);
    len += tp-tmp;

    return len;
}